

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int sftp_stat(LIBSSH2_SFTP *sftp,char *path,uint path_len,int stat_type,
             LIBSSH2_SFTP_ATTRIBUTES *attrs)

{
  int iVar1;
  uint32_t uVar2;
  ssize_t sVar3;
  uchar *puVar4;
  int local_7c;
  uint32_t retcode;
  ssize_t nwritten;
  uchar *puStack_60;
  int rc;
  uchar *data;
  uchar *s;
  ssize_t packet_len;
  size_t data_len;
  LIBSSH2_SESSION *session;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP_ATTRIBUTES *attrs_local;
  int stat_type_local;
  uint path_len_local;
  char *path_local;
  LIBSSH2_SFTP *sftp_local;
  
  session = (LIBSSH2_SESSION *)sftp->channel;
  data_len = (size_t)session->kex_prefs;
  packet_len = 0;
  channel = (LIBSSH2_CHANNEL *)attrs;
  attrs_local._0_4_ = stat_type;
  attrs_local._4_4_ = path_len;
  _stat_type_local = path;
  path_local = (char *)sftp;
  if (stat_type == 2) {
    local_7c = sftp_attrsize(attrs->flags);
  }
  else {
    local_7c = 0;
  }
  s = (uchar *)(ulong)(path_len + 0xd + local_7c);
  puStack_60 = (uchar *)0x0;
  if (*(int *)(path_local + 0x14c) != 0) goto LAB_0013ae25;
  path_local[0x48] = '\0';
  path_local[0x49] = '\0';
  path_local[0x4a] = '\0';
  path_local[0x4b] = '\0';
  data = (uchar *)(**(code **)(data_len + 8))(s,data_len);
  *(uchar **)(path_local + 0x150) = data;
  if (*(long *)(path_local + 0x150) == 0) {
    iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-6,
                           "Unable to allocate memory for FXP_*STAT packet");
    return iVar1;
  }
  _libssh2_store_u32(&data,(int)s - 4);
  if ((int)attrs_local == 0) {
LAB_0013adac:
    *data = '\x11';
  }
  else if ((int)attrs_local == 1) {
    *data = '\a';
  }
  else {
    if ((int)attrs_local != 2) goto LAB_0013adac;
    *data = '\t';
  }
  data = data + 1;
  iVar1 = *(int *)(path_local + 8);
  *(int *)(path_local + 8) = iVar1 + 1;
  *(int *)(path_local + 0x158) = iVar1;
  _libssh2_store_u32(&data,*(uint32_t *)(path_local + 0x158));
  _libssh2_store_str(&data,_stat_type_local,(ulong)attrs_local._4_4_);
  if ((int)attrs_local == 2) {
    sVar3 = sftp_attr2bin(data,(LIBSSH2_SFTP_ATTRIBUTES *)channel);
    data = data + sVar3;
  }
  path_local[0x14c] = '\x02';
  path_local[0x14d] = '\0';
  path_local[0x14e] = '\0';
  path_local[0x14f] = '\0';
LAB_0013ae25:
  if (*(int *)(path_local + 0x14c) == 2) {
    puVar4 = (uchar *)_libssh2_channel_write
                                ((LIBSSH2_CHANNEL *)session,0,*(uchar **)(path_local + 0x150),
                                 (size_t)s);
    if (puVar4 == (uchar *)0xffffffffffffffdb) {
      return -0x25;
    }
    if (s != puVar4) {
      (**(code **)(data_len + 0x18))(*(undefined8 *)(path_local + 0x150),data_len);
      path_local[0x150] = '\0';
      path_local[0x151] = '\0';
      path_local[0x152] = '\0';
      path_local[0x153] = '\0';
      path_local[0x154] = '\0';
      path_local[0x155] = '\0';
      path_local[0x156] = '\0';
      path_local[0x157] = '\0';
      path_local[0x14c] = '\0';
      path_local[0x14d] = '\0';
      path_local[0x14e] = '\0';
      path_local[0x14f] = '\0';
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)data_len,-7,
                             "Unable to send STAT/LSTAT/SETSTAT command");
      return iVar1;
    }
    (**(code **)(data_len + 0x18))(*(undefined8 *)(path_local + 0x150),data_len);
    path_local[0x150] = '\0';
    path_local[0x151] = '\0';
    path_local[0x152] = '\0';
    path_local[0x153] = '\0';
    path_local[0x154] = '\0';
    path_local[0x155] = '\0';
    path_local[0x156] = '\0';
    path_local[0x157] = '\0';
    path_local[0x14c] = '\x03';
    path_local[0x14d] = '\0';
    path_local[0x14e] = '\0';
    path_local[0x14f] = '\0';
  }
  iVar1 = sftp_packet_requirev
                    ((LIBSSH2_SFTP *)path_local,2,"ie",*(uint32_t *)(path_local + 0x158),
                     &stack0xffffffffffffffa0,(size_t *)&packet_len,9);
  if (iVar1 == -0x25) {
    sftp_local._4_4_ = -0x25;
  }
  else if (iVar1 == -0x26) {
    if (packet_len != 0) {
      (**(code **)(data_len + 0x18))(puStack_60,data_len);
    }
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP stat packet too short");
  }
  else if (iVar1 == 0) {
    path_local[0x14c] = '\0';
    path_local[0x14d] = '\0';
    path_local[0x14e] = '\0';
    path_local[0x14f] = '\0';
    if (*puStack_60 == 'e') {
      uVar2 = _libssh2_ntohu32(puStack_60 + 5);
      (**(code **)(data_len + 0x18))(puStack_60);
      if (uVar2 == 0) {
        memset(channel,0,0x38);
        sftp_local._4_4_ = 0;
      }
      else {
        *(uint32_t *)(path_local + 0x48) = uVar2;
        sftp_local._4_4_ = _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"SFTP Protocol Error");
      }
    }
    else {
      memset(channel,0,0x38);
      sVar3 = sftp_bin2attr((LIBSSH2_SFTP_ATTRIBUTES *)channel,puStack_60 + 5,packet_len - 5);
      if (sVar3 < 0) {
        (**(code **)(data_len + 0x18))(puStack_60,data_len);
        sftp_local._4_4_ =
             _libssh2_error((LIBSSH2_SESSION *)data_len,-0x1f,"Attributes too short in SFTP fstat");
      }
      else {
        (**(code **)(data_len + 0x18))(puStack_60,data_len);
        sftp_local._4_4_ = 0;
      }
    }
  }
  else {
    path_local[0x14c] = '\0';
    path_local[0x14d] = '\0';
    path_local[0x14e] = '\0';
    path_local[0x14f] = '\0';
    sftp_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_len,iVar1,"Timeout waiting for status message");
  }
  return sftp_local._4_4_;
}

Assistant:

static int sftp_stat(LIBSSH2_SFTP *sftp, const char *path,
                     unsigned int path_len, int stat_type,
                     LIBSSH2_SFTP_ATTRIBUTES * attrs)
{
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t data_len = 0;
    /* 13 = packet_len(4) + packet_type(1) + request_id(4) + path_len(4) */
    ssize_t packet_len =
        path_len + 13 +
        ((stat_type ==
          LIBSSH2_SFTP_SETSTAT) ? sftp_attrsize(attrs->flags) : 0);
    unsigned char *s, *data = NULL;
    static const unsigned char stat_responses[2] =
        { SSH_FXP_ATTRS, SSH_FXP_STATUS };
    int rc;

    if(sftp->stat_state == libssh2_NB_state_idle) {
        sftp->last_errno = LIBSSH2_FX_OK;

        _libssh2_debug((session, LIBSSH2_TRACE_SFTP, "%s %s",
                       (stat_type == LIBSSH2_SFTP_SETSTAT) ? "Set-statting" :
                       (stat_type ==
                        LIBSSH2_SFTP_LSTAT ? "LStatting" : "Statting"), path));
        s = sftp->stat_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!sftp->stat_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for FXP_*STAT "
                                  "packet");
        }

        _libssh2_store_u32(&s, (uint32_t)(packet_len - 4));

        switch(stat_type) {
        case LIBSSH2_SFTP_SETSTAT:
            *(s++) = SSH_FXP_SETSTAT;
            break;

        case LIBSSH2_SFTP_LSTAT:
            *(s++) = SSH_FXP_LSTAT;
            break;

        case LIBSSH2_SFTP_STAT:
        default:
            *(s++) = SSH_FXP_STAT;
        }
        sftp->stat_request_id = sftp->request_id++;
        _libssh2_store_u32(&s, sftp->stat_request_id);
        _libssh2_store_str(&s, path, path_len);

        if(stat_type == LIBSSH2_SFTP_SETSTAT)
            s += sftp_attr2bin(s, attrs);

        sftp->stat_state = libssh2_NB_state_created;
    }

    if(sftp->stat_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0,
                                          sftp->stat_packet, packet_len);
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if(packet_len != nwritten) {
            LIBSSH2_FREE(session, sftp->stat_packet);
            sftp->stat_packet = NULL;
            sftp->stat_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send STAT/LSTAT/SETSTAT command");
        }
        LIBSSH2_FREE(session, sftp->stat_packet);
        sftp->stat_packet = NULL;

        sftp->stat_state = libssh2_NB_state_sent;
    }

    rc = sftp_packet_requirev(sftp, 2, stat_responses,
                              sftp->stat_request_id, &data, &data_len, 9);
    if(rc == LIBSSH2_ERROR_EAGAIN)
        return rc;
    else if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
        if(data_len > 0) {
            LIBSSH2_FREE(session, data);
        }
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "SFTP stat packet too short");
    }
    else if(rc) {
        sftp->stat_state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc,
                              "Timeout waiting for status message");
    }

    sftp->stat_state = libssh2_NB_state_idle;

    if(data[0] == SSH_FXP_STATUS) {
        uint32_t retcode;

        retcode = _libssh2_ntohu32(data + 5);
        LIBSSH2_FREE(session, data);
        if(retcode == LIBSSH2_FX_OK) {
            memset(attrs, 0, sizeof(LIBSSH2_SFTP_ATTRIBUTES));
            return 0;
        }
        else {
            sftp->last_errno = retcode;
            return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                  "SFTP Protocol Error");
        }
    }

    memset(attrs, 0, sizeof(LIBSSH2_SFTP_ATTRIBUTES));
    if(sftp_bin2attr(attrs, data + 5, data_len - 5) < 0) {
        LIBSSH2_FREE(session, data);
        return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                              "Attributes too short in SFTP fstat");
    }

    LIBSSH2_FREE(session, data);

    return 0;
}